

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O0

bool __thiscall
YAML::EmitterState::SetStringFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  int in_ESI;
  value in_stack_00000040;
  EMITTER_MANIP in_stack_00000044;
  Setting<YAML::EMITTER_MANIP> *in_stack_00000048;
  EmitterState *in_stack_00000050;
  bool local_1;
  
  if ((in_ESI == 0) || (in_ESI - 6U < 3)) {
    _Set<YAML::EMITTER_MANIP>
              (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EmitterState::SetStringFormat(EMITTER_MANIP value, FmtScope::value scope) {
  switch (value) {
    case Auto:
    case SingleQuoted:
    case DoubleQuoted:
    case Literal:
      _Set(m_strFmt, value, scope);
      return true;
    default:
      return false;
  }
}